

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupZero(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  int local_1c;
  int i;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCiNum(p);
  iVar2 = Gia_ManCoNum(p);
  p_00 = Gia_ManStart(iVar1 + 1 + iVar2);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManCiNum(p);
    if (iVar1 <= local_1c) break;
    Gia_ManAppendCi(p_00);
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManCoNum(p);
    if (iVar1 <= local_1c) break;
    Gia_ManAppendCo(p_00,0);
    local_1c = local_1c + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupZero( Gia_Man_t * p )
{
    Gia_Man_t * pNew; int i;
    pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}